

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O1

ostream * std::operator<<(ostream *os,int2 *v)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  poVar1 = (ostream *)std::ostream::operator<<(os,v->_M_elems[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->_M_elems[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::int2 &v) {
  os << "(" << v[0] << ", " << v[1] << ")";
  return os;
}